

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

string * __thiscall
despot::AdventurerState::text_abi_cxx11_(string *__return_storage_ptr__,AdventurerState *this)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  to_string<int>(&local_38,*(int *)&this->field_0xc);
  std::operator+(&local_78,"s",&local_38);
  std::operator+(&local_58,&local_78,"-");
  to_string<int>(&sStack_98,*(int *)&this->field_0xc / *(int *)(Adventurer::current_ + 0x50));
  std::operator+(__return_storage_ptr__,&local_58,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string AdventurerState::text() const {
	return "s" + to_string(state_id) + "-" + to_string(state_id / Adventurer::current_->size_);
}